

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
djb::matrix::eigenvector
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,matrix *this,
          int iterations)

{
  reference pvVar1;
  double dVar2;
  pointer *local_e8;
  vector<double,_std::allocator<double>_> *local_90;
  int local_88;
  int local_84;
  int k_1;
  int k;
  double nrm;
  int local_70;
  int i_1;
  int i;
  int local_5c;
  undefined1 local_58 [4];
  int j;
  vector<double,_std::allocator<double>_> vec [2];
  int iterations_local;
  matrix *this_local;
  
  local_90 = (vector<double,_std::allocator<double>_> *)local_58;
  do {
    std::vector<double,_std::allocator<double>_>::vector(local_90);
    local_90 = local_90 + 1;
  } while (local_90 !=
           (vector<double,_std::allocator<double>_> *)
           &vec[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  local_5c = 0;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)local_58,(long)this->size);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)
             &vec[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)this->size);
  for (local_70 = 0; local_70 < this->size; local_70 = local_70 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (local_58 + (long)local_5c * 0x18),(long)local_70);
    *pvVar1 = 1.0;
  }
  for (nrm._4_4_ = 0; nrm._4_4_ < iterations; nrm._4_4_ = nrm._4_4_ + 1) {
    _k_1 = 0.0;
    transform(this,(vector<double,_std::allocator<double>_> *)(local_58 + (long)local_5c * 0x18),
              (vector<double,_std::allocator<double>_> *)(local_58 + (long)(1 - local_5c) * 0x18));
    for (local_84 = 0; local_84 < this->size; local_84 = local_84 + 1) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (local_58 + (long)(1 - local_5c) * 0x18),(long)local_84);
      dVar2 = sqr<double>(pvVar1);
      _k_1 = dVar2 + _k_1;
    }
    if (0.0 < _k_1) {
      _k_1 = inversesqrt<double>((double *)&k_1);
      for (local_88 = 0; dVar2 = _k_1, local_88 < this->size; local_88 = local_88 + 1) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            (local_58 + (long)(1 - local_5c) * 0x18),(long)local_88);
        *pvVar1 = dVar2 * *pvVar1;
      }
    }
    local_5c = 1 - local_5c;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (vector<double,_std::allocator<double>_> *)(local_58 + (long)local_5c * 0x18));
  local_e8 = &vec[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  do {
    local_e8 = local_e8 + -3;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_e8);
  } while (local_e8 != (pointer *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> matrix::eigenvector(int iterations) const
{
	std::vector<double> vec[2];
	int j = 0;

	vec[0].reserve(size);
	vec[1].reserve(size);

	for (int i = 0; i < size; ++i)
		vec[j][i] = 1.0;
	for (int i = 0; i < iterations; ++i) {
		double nrm = 0;

		transform(vec[j], vec[1-j]);

#if 1
		// normalize the vector
		for (int k = 0; k < size; ++k)
			nrm+= sqr(vec[1-j][k]);
		if (nrm > 0) {
			nrm = inversesqrt(nrm);

			for (int k = 0; k < size; ++k)
				vec[1-j][k]*= nrm;
		}
#endif

		j = 1 - j;
	}

	return vec[j];
}